

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVM.cpp
# Opt level: O0

uchar __thiscall NanoVM::pop<unsigned_char>(NanoVM *this)

{
  uchar value;
  NanoVM *this_local;
  
  if ((this->cpu).registers[7] - 1 < (this->cpu).codeSize) {
    this->errorFlag = 0x80;
    this_local._7_1_ = '\0';
  }
  else {
    this_local._7_1_ = (this->cpu).codeBase[(this->cpu).registers[7] - 1];
    (this->cpu).registers[7] = (this->cpu).registers[7] - 1;
  }
  return this_local._7_1_;
}

Assistant:

inline T NanoVM::pop() {
	// Check bounds
	if (cpu.registers[esp] - sizeof(T) < cpu.codeSize) {
		// Reached the bottom of stack
		errorFlag = STACK_ERROR;
		return 0;
	}
	// pop value from stack
	T value = *reinterpret_cast<T*>(cpu.codeBase + cpu.registers[esp] - sizeof(T));
	// update esp
	cpu.registers[esp] -= sizeof(value);
	return value;
}